

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void printHelp(string *progName)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"usage: ");
  poVar1 = std::operator<<(poVar1,(string *)progName);
  poVar1 = std::operator<<(poVar1," [options]");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"  basic user options: ");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"    -h --help   \tshow this message");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"    -v --version\tshow version");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,
                           "when no options are specified program waits for input of boxes on stdin in the following format: "
                          );
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"<n>");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,
                           "<length of first side of first box> <length of second side of first box> "
                          );
  poVar1 = std::operator<<(poVar1,"<length of third side of first box>");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,
                           "<length of first side of second box> <length of second side of second box> "
                          );
  poVar1 = std::operator<<(poVar1,"<length of third side of second box>");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"...");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,
                           "<length of first side of nth box> <length of second side of nth box> ");
  poVar1 = std::operator<<(poVar1,"<length of third side of nth box>");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<(poVar1,"where n is positive integer and the lengths are decimal numbers between ")
  ;
  poVar1 = std::ostream::_M_insert<double>(0.5);
  std::operator<<(poVar1," and ");
  poVar1 = std::ostream::_M_insert<double>(1.0);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"Example:");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"4");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"0.9 0.9 0.9");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"0.8 0.8 0.8");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"0.7 0.7 0.7");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"0.6 0.6 0.6");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,
                           "once specifications are given program will calculate the most efficient way to stack those boxes and write "
                          );
  poVar1 = std::operator<<(poVar1,"the amount of visible boxes to stdout as a single number");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  printVersion();
  return;
}

Assistant:

void printHelp(const std::string& progName)
{
	std::cout
		<< "usage: " << progName << " [options]" << std::endl
		<< "  basic user options: " << std::endl
		<< "    -h --help   \tshow this message" << std::endl
		<< "    -v --version\tshow version" << std::endl
		<< std::endl
		<< "when no options are specified program waits for input of boxes on stdin in the following format: "
		<< std::endl
		<< std::endl
		<< "<n>" << std::endl
		<< "<length of first side of first box> <length of second side of first box> "
		<< "<length of third side of first box>" << std::endl
		<< "<length of first side of second box> <length of second side of second box> "
		<< "<length of third side of second box>" << std::endl
		<< "..." << std::endl
		<< "<length of first side of nth box> <length of second side of nth box> "
		<< "<length of third side of nth box>" << std::endl
		<< std::endl
		<< "where n is positive integer and the lengths are decimal numbers between " << BoxNesting::Box::minLength
		<< " and " << BoxNesting::Box::maxLength << std::endl
		<< std::endl
		<< "Example:" << std::endl
		<< "4" << std::endl
		<< "0.9 0.9 0.9" << std::endl
		<< "0.8 0.8 0.8" << std::endl
		<< "0.7 0.7 0.7" << std::endl
		<< "0.6 0.6 0.6" << std::endl
		<< std::endl
		<< "once specifications are given program will calculate the most efficient way to stack those boxes and write "
		<< "the amount of visible boxes to stdout as a single number" << std::endl
		<< std::endl;

	printVersion();
}